

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMap<int,_QTuioCursor>::insert(QMap<int,_QTuioCursor> *this,int *key,QTuioCursor *value)

{
  long lVar1;
  bool bVar2;
  QMap<int,_QTuioCursor> *in_RDI;
  long in_FS_OFFSET;
  QMap<int,_QTuioCursor> copy;
  iterator in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffc9;
  key_type *in_stack_ffffffffffffffd0;
  map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>
  *this_00;
  iterator local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>
             *)0xaaaaaaaaaaaaaaaa;
  bVar2 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
          ::isShared(&in_RDI->d);
  if (bVar2) {
    QMap(in_RDI,(QMap<int,_QTuioCursor> *)in_stack_ffffffffffffff98._M_node);
  }
  else {
    memset(&stack0xffffffffffffffd8,0,8);
    QMap((QMap<int,_QTuioCursor> *)0x114bd2);
  }
  detach(in_RDI);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QTuioCursor,_std::less<int>,_std::allocator<std::pair<const_int,_QTuioCursor>_>_>_>_>
                *)0x114be6);
  std::map<int,QTuioCursor,std::less<int>,std::allocator<std::pair<int_const,QTuioCursor>>>::
  insert_or_assign<QTuioCursor_const&>
            (this_00,in_stack_ffffffffffffffd0,
             (QTuioCursor *)CONCAT71(in_stack_ffffffffffffffc9,in_stack_ffffffffffffffc8));
  iterator::iterator((iterator *)0x114c30,in_stack_ffffffffffffff98);
  ~QMap((QMap<int,_QTuioCursor> *)0x114c3a);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)(iterator)local_20._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        // TODO: improve. In case of assignment, why copying first?
        detach();
        return iterator(d->m.insert_or_assign(key, value).first);
    }